

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O0

void __thiscall DBot::Dofire(DBot *this,ticcmd_t *cmd)

{
  double dVar1;
  double dVar2;
  APlayerPawn *pAVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  double dVar10;
  TAngle<double> local_108;
  TAngle<double> local_100;
  TAngle<double> local_f8;
  TAngle<double> local_f0;
  TFlags<ActorFlag,_unsigned_int> local_e4;
  undefined1 local_e0 [24];
  undefined1 local_c8 [32];
  TVector2<double> local_a8;
  DVector3 local_98;
  TVector3<double> local_80;
  TAngle<double> local_68;
  undefined1 local_60 [20];
  TFlags<ActorFlag,_unsigned_int> local_4c;
  DAngle local_48;
  double fm;
  DAngle m;
  DAngle an;
  double Dist;
  int local_20;
  int aiming_value;
  int aiming_penalty;
  bool no_fire;
  ticcmd_t *cmd_local;
  DBot *this_local;
  
  TAngle<double>::TAngle(&m);
  TAngle<double>::TAngle((TAngle<double> *)&fm);
  pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  bVar4 = true;
  if (pAVar8 != (AActor *)0x0) {
    pAVar8 = TObjPtr<AActor>::operator->(&this->enemy);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_4c,
               (int)pAVar8 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    bVar4 = true;
    if (uVar5 != 0) {
      pAVar8 = TObjPtr<AActor>::operator->(&this->enemy);
      bVar4 = pAVar8->health < 1;
    }
  }
  if (bVar4) {
    return;
  }
  if (this->player->ReadyWeapon == (AWeapon *)0x0) {
    return;
  }
  if ((this->skill).isp < this->player->damagecount) {
    this->first_shot = true;
    return;
  }
  if (((this->first_shot & 1U) != 0) &&
     ((*(uint *)&(this->player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc &
      0x80000000) == 0)) {
    iVar7 = (this->skill).reaction;
    iVar6 = FRandom::operator()(&pr_botdofire);
    this->t_react = (0x65 - iVar7) / (iVar6 % 3 + 3);
  }
  this->first_shot = false;
  if (this->t_react != 0) {
    return;
  }
  aiming_value._3_1_ = true;
  pAVar3 = this->player->mo;
  pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  dVar10 = (this->player->mo->super_AActor).Vel.X;
  pAVar9 = TObjPtr<AActor>::operator->(&this->enemy);
  dVar1 = (pAVar9->Vel).X;
  dVar2 = (this->player->mo->super_AActor).Vel.Y;
  pAVar9 = TObjPtr<AActor>::operator->(&this->enemy);
  dVar10 = AActor::Distance2D(&pAVar3->super_AActor,pAVar8,dVar10 - dVar1,dVar2 - (pAVar9->Vel).Y,
                              false);
  if ((*(uint *)&(this->player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc &
      0x8000) == 0) {
    if ((*(uint *)&(this->player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc &
        0x10000000) != 0) {
      iVar7 = FRandom::operator()(&pr_botdofire);
      if (iVar7 % 200 <= (this->skill).reaction) {
        pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
        TAngle<double>::TAngle((TAngle<double> *)(local_60 + 8),60.0);
        bVar4 = Check_LOS(this,pAVar8,(DAngle *)(local_60 + 8));
        aiming_value._3_1_ = !bVar4;
      }
      goto LAB_00433382;
    }
    if (this->player->ReadyWeapon->ProjectileType == (PClassActor *)0x0) {
      pAVar3 = this->player->mo;
      pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      AActor::AngleTo((AActor *)local_e0,&pAVar3->super_AActor,SUB81(pAVar8,0));
      TAngle<double>::operator=(&this->Angle,(TAngle<double> *)local_e0);
      local_20 = 0;
      pAVar8 = TObjPtr<AActor>::operator->(&this->enemy);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_e4,
                 (int)pAVar8 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
      if (uVar5 != 0) {
        iVar7 = FRandom::operator()(&pr_botdofire);
        local_20 = iVar7 % 0x19 + 10;
      }
      pAVar8 = TObjPtr<AActor>::operator->(&this->enemy);
      if (pAVar8->Sector->lightlevel < 0x32) {
        iVar7 = FRandom::operator()(&pr_botdofire);
        local_20 = iVar7 % 0x28 + local_20;
      }
      if (this->player->damagecount != 0) {
        local_20 = this->player->damagecount + local_20;
      }
      Dist._4_4_ = (this->skill).aiming - local_20;
      if (Dist._4_4_ < 1) {
        Dist._4_4_ = 1;
      }
      TAngle<double>::operator=((TAngle<double> *)&fm,30.0 - ((double)Dist._4_4_ * 60.0) / 200.0);
      bVar4 = TAngle<double>::operator<=((TAngle<double> *)&fm,0.0);
      if (bVar4) {
        TAngle<double>::operator=((TAngle<double> *)&fm,1.0);
      }
      bVar4 = TAngle<double>::operator!=((TAngle<double> *)&fm,0.0);
      if (bVar4) {
        if ((this->increase & 1U) == 0) {
          TAngle<double>::TAngle(&local_f8,(TAngle<double> *)&fm);
          TAngle<double>::operator-=(&this->Angle,&local_f8);
        }
        else {
          TAngle<double>::TAngle(&local_f0,(TAngle<double> *)&fm);
          TAngle<double>::operator+=(&this->Angle,&local_f0);
        }
      }
      absangle<double>(&local_100,&this->Angle);
      bVar4 = TAngle<double>::operator<(&local_100,4.0);
      if (bVar4) {
        this->increase = (bool)((this->increase ^ 0xffU) & 1);
      }
      pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      TAngle<double>::TAngle(&local_108,30.0);
      bVar4 = Check_LOS(this,pAVar8,&local_108);
      aiming_value._3_1_ = !bVar4;
      goto LAB_00433382;
    }
    if ((*(uint *)&(this->player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc &
        0x40000000) != 0) {
      pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      FireRox((DBot *)local_60,(AActor *)this,(ticcmd_t *)pAVar8);
      TAngle<double>::operator=(&m,(TAngle<double> *)local_60);
      bVar4 = TAngle<double>::operator!=(&m,0.0);
      if (bVar4) {
        TAngle<double>::operator=(&this->Angle,&m);
        absangle<double>(&local_68,&m);
        bVar4 = TAngle<double>::operator<(&local_68,12.0);
        if (bVar4) {
          this->t_rocket = 9;
        }
        aiming_value._3_1_ = !bVar4;
      }
    }
  }
  else {
    if (this->player->ReadyWeapon->ProjectileType == (PClassActor *)0x0) {
      aiming_value._3_1_ = 256.0 < dVar10;
      goto LAB_00433382;
    }
    bVar4 = AWeapon::CheckAmmo(this->player->ReadyWeapon,0,false,true,-1);
    if (!bVar4) {
      if ((*(uint *)&(this->player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc
          & 0x20) == 0) {
        return;
      }
      goto LAB_00433382;
    }
  }
  pAVar3 = this->player->mo;
  pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  dVar10 = AActor::Distance2D(&pAVar3->super_AActor,pAVar8,false);
  pAVar8 = GetDefaultByType(&this->player->ReadyWeapon->ProjectileType->super_PClass);
  local_48.Degrees = dVar10 / pAVar8->Speed;
  pAVar8 = TObjPtr<AActor>::operator->(&this->enemy);
  AActor::Pos(&local_98,pAVar8);
  TObjPtr<AActor>::operator->(&this->enemy);
  TVector3<double>::XY((TVector3<double> *)local_c8);
  ::operator*((TVector2<double> *)(local_c8 + 0x10),local_48.Degrees);
  ::operator*(&local_a8,2.0);
  operator+(&local_80,&local_98,&local_a8);
  FCajunMaster::SetBodyAt(&bglobal,&local_80,1);
  pAVar3 = this->player->mo;
  pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.body1);
  AActor::AngleTo((AActor *)(local_e0 + 0x10),&pAVar3->super_AActor,SUB81(pAVar8,0));
  TAngle<double>::operator=(&this->Angle,(TAngle<double> *)(local_e0 + 0x10));
  pAVar8 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  TAngle<double>::TAngle((TAngle<double> *)(local_e0 + 8),60.0);
  bVar4 = Check_LOS(this,pAVar8,(DAngle *)(local_e0 + 8));
  if (bVar4) {
    aiming_value._3_1_ = false;
  }
LAB_00433382:
  if (!aiming_value._3_1_) {
    (cmd->ucmd).buttons = (cmd->ucmd).buttons | 1;
  }
  return;
}

Assistant:

void DBot::Dofire (ticcmd_t *cmd)
{
	bool no_fire; //used to prevent bot from pumping rockets into nearby walls.
	int aiming_penalty=0; //For shooting at shading target, if screen is red, MAKEME: When screen red.
	int aiming_value; //The final aiming value.
	double Dist;
	DAngle an;
	DAngle m;
	double fm;

	if (!enemy || !(enemy->flags & MF_SHOOTABLE) || enemy->health <= 0)
		return;

	if (player->ReadyWeapon == NULL)
		return;

	if (player->damagecount > skill.isp)
	{
		first_shot = true;
		return;
	}

	//Reaction skill thing.
	if (first_shot &&
		!(player->ReadyWeapon->WeaponFlags & WIF_BOT_REACTION_SKILL_THING))
	{
		t_react = (100-skill.reaction+1)/((pr_botdofire()%3)+3);
	}
	first_shot = false;
	if (t_react)
		return;

	//MAKEME: Decrease the rocket suicides even more.

	no_fire = true;
	//Distance to enemy.
	Dist = player->mo->Distance2D(enemy, player->mo->Vel.X - enemy->Vel.X, player->mo->Vel.Y - enemy->Vel.Y);

	//FIRE EACH TYPE OF WEAPON DIFFERENT: Here should all the different weapons go.
	if (player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON)
	{
		if ((player->ReadyWeapon->ProjectileType != NULL))
		{
			if (player->ReadyWeapon->CheckAmmo (AWeapon::PrimaryFire, false, true))
			{
				// This weapon can fire a projectile and has enough ammo to do so
				goto shootmissile;
			}
			else if (!(player->ReadyWeapon->WeaponFlags & WIF_AMMO_OPTIONAL))
			{
				// Ammo is required, so don't shoot. This is for weapons that shoot
				// missiles that die at close range, such as the powered-up Phoneix Rod.
				return;
			}
		}
		else
		{
			//*4 is for atmosphere,  the chainsaws sounding and all..
			no_fire = (Dist > DEFMELEERANGE*4);
		}
	}
	else if (player->ReadyWeapon->WeaponFlags & WIF_BOT_BFG)
	{
		//MAKEME: This should be smarter.
		if ((pr_botdofire()%200)<=skill.reaction)
			if(Check_LOS(enemy, SHOOTFOV))
				no_fire = false;
	}
	else if (player->ReadyWeapon->ProjectileType != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			//Special rules for RL
			an = FireRox (enemy, cmd);
			if(an != 0)
			{
				Angle = an;
				//have to be somewhat precise. to avoid suicide.
				if (absangle(an, player->mo->Angles.Yaw) < 12.)
				{
					t_rocket = 9;
					no_fire = false;
				}
			}
		}
		// prediction aiming
shootmissile:
		Dist = player->mo->Distance2D(enemy);
		fm = Dist / GetDefaultByType (player->ReadyWeapon->ProjectileType)->Speed;
		bglobal.SetBodyAt(enemy->Pos() + enemy->Vel.XY() * fm * 2, 1);
		Angle = player->mo->AngleTo(bglobal.body1);
		if (Check_LOS (enemy, SHOOTFOV))
			no_fire = false;
	}
	else
	{
		//Other weapons, mostly instant hit stuff.
		Angle = player->mo->AngleTo(enemy);
		aiming_penalty = 0;
		if (enemy->flags & MF_SHADOW)
			aiming_penalty += (pr_botdofire()%25)+10;
		if (enemy->Sector->lightlevel<WHATS_DARK/* && !(player->powers & PW_INFRARED)*/)
			aiming_penalty += pr_botdofire()%40;//Dark
		if (player->damagecount)
			aiming_penalty += player->damagecount; //Blood in face makes it hard to aim
		aiming_value = skill.aiming - aiming_penalty;
		if (aiming_value <= 0)
			aiming_value = 1;
		m = ((SHOOTFOV/2)-(aiming_value*SHOOTFOV/200)); //Higher skill is more accurate
		if (m <= 0)
			m = 1.; //Prevents lock.

		if (m != 0)
		{
			if (increase)
				Angle += m;
			else
				Angle -= m;
		}

		if (absangle(Angle, player->mo->Angles.Yaw) < 4.)
		{
			increase = !increase;
		}

		if (Check_LOS (enemy, (SHOOTFOV/2)))
			no_fire = false;
	}
	if (!no_fire) //If going to fire weapon
	{
		cmd->ucmd.buttons |= BT_ATTACK;
	}
	//Prevents bot from jerking, when firing automatic things with low skill.
}